

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O2

void UnitTest::CheckEqual<int,double>
               (TestResults *results,int *expected,double *actual,TestDetails *details)

{
  ostream *poVar1;
  char *failure;
  MemoryOutStream stream;
  MemoryOutStream local_1c0;
  
  if ((*actual != (double)*expected) || (NAN(*actual) || NAN((double)*expected))) {
    MemoryOutStream::MemoryOutStream(&local_1c0);
    poVar1 = std::operator<<((ostream *)&local_1c0,"Expected ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*expected);
    std::operator<<(poVar1," but was ");
    std::ostream::_M_insert<double>(*actual);
    failure = MemoryOutStream::GetText(&local_1c0);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream(&local_1c0);
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}